

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O2

HashEntry * raviX_hash_table_next_entry(HashTable *ht,HashEntry *entry)

{
  HashEntry *pHVar1;
  HashEntry *pHVar2;
  
  if (entry == (HashEntry *)0x0) {
    pHVar1 = ht->table;
    pHVar2 = pHVar1;
  }
  else {
    pHVar1 = entry + 1;
    pHVar2 = ht->table;
  }
  while( true ) {
    if (pHVar1 == pHVar2 + ht->size) {
      return (HashEntry *)0x0;
    }
    if ((uint32_t *)pHVar1->key != (uint32_t *)0x0 && (uint32_t *)pHVar1->key != &deleted_key_value)
    break;
    pHVar1 = pHVar1 + 1;
  }
  return pHVar1;
}

Assistant:

HashEntry *
raviX_hash_table_next_entry(HashTable *ht, HashEntry *entry)
{
	if (entry == NULL)
		entry = ht->table;
	else
		entry = entry + 1;

	for (; entry != ht->table + ht->size; entry++) {
		if (entry_is_present(entry)) {
			return entry;
		}
	}

	return NULL;
}